

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportjsonext.cpp
# Opt level: O3

void __thiscall trun::ResultsReportJSONExtensive::DumpNewStruct(ResultsReportJSONExtensive *this)

{
  bool bVar1;
  int iVar2;
  ResultSummary *pRVar3;
  pointer psVar4;
  long lVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  initializer_list<std::pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
  testFunctions;
  vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
  results;
  shared_ptr<trun::TestFunc> testFunction;
  allocator_type local_106;
  less<trun::kTestResult> local_105;
  anon_enum_8 local_104 [4];
  vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
  local_100;
  vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
  local_e8;
  element_type *local_d0;
  _Alloc_hider local_c8;
  pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  if ((((this->super_ResultsReportJSON).bHadFailures != false) ||
      ((this->super_ResultsReportJSON).bHadSummary != false)) ||
     ((this->super_ResultsReportJSON).bHadSuccess == true)) {
    ResultsReportPinterBase::WriteNoIndent((ResultsReportPinterBase *)this,",\n");
  }
  pRVar3 = ResultSummary::Instance();
  std::
  vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>::
  vector(&local_e8,&pRVar3->results);
  pRVar3 = ResultSummary::Instance();
  std::vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>::
  vector(&local_100,&pRVar3->testFunctions);
  if (DumpNewStruct()::resultToName_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&DumpNewStruct()::resultToName_abi_cxx11_);
    if (iVar2 != 0) {
      local_104[3] = 0;
      std::
      pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<trun::kTestResult,_const_char_(&)[5],_true>
                ((pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_104 + 3,(char (*) [5])"Pass");
      local_104[2] = 3;
      std::
      pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<trun::kTestResult,_const_char_(&)[8],_true>
                (&local_a8,local_104 + 2,(char (*) [8])"AllFail");
      local_104[1] = 2;
      std::
      pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<trun::kTestResult,_const_char_(&)[11],_true>
                (&local_80,local_104 + 1,(char (*) [11])"ModuleFail");
      local_104[0] = kTestResult_TestFail;
      std::
      pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<trun::kTestResult,_const_char_(&)[9],_true>
                (&local_58,local_104,(char (*) [9])"TestFail");
      __l._M_len = 4;
      __l._M_array = (iterator)&local_d0;
      std::
      map<trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<trun::kTestResult>,_std::allocator<std::pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map(&DumpNewStruct()::resultToName_abi_cxx11_,__l,&local_105,&local_106);
      lVar5 = -0xa0;
      paVar6 = &local_58.second.field_2;
      do {
        if (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar6->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar6->_M_allocated_capacity)[-2],
                          paVar6->_M_allocated_capacity + 1);
        }
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar6->_M_allocated_capacity + -5);
        lVar5 = lVar5 + 0x28;
      } while (lVar5 != 0);
      __cxa_atexit(std::
                   map<trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<trun::kTestResult>,_std::allocator<std::pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~map,&DumpNewStruct()::resultToName_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&DumpNewStruct()::resultToName_abi_cxx11_);
    }
  }
  ResultsReportPinterBase::WriteLine((ResultsReportPinterBase *)this,"\"Results\" : [");
  ResultsReportPinterBase::PushIndent((ResultsReportPinterBase *)this);
  if (local_100.
      super__Vector_base<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_100.
      super__Vector_base<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar1 = false;
    psVar4 = local_100.
             super__Vector_base<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_d0 = (psVar4->super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_c8._M_p =
           (pointer)(psVar4->super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_p !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_p)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_p)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_p)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_p)->_M_use_count + 1;
        }
      }
      if (bVar1) {
        ResultsReportPinterBase::WriteNoIndent((ResultsReportPinterBase *)this,",\n");
      }
      PrintFuncResult(this,(Ref *)&local_d0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_p !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_p);
      }
      psVar4 = psVar4 + 1;
      bVar1 = true;
    } while (psVar4 != local_100.
                       super__Vector_base<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  ResultsReportPinterBase::PopIndent((ResultsReportPinterBase *)this);
  ResultsReportPinterBase::WriteLine((ResultsReportPinterBase *)this,"");
  ResultsReportPinterBase::Write((ResultsReportPinterBase *)this,"]");
  std::vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>::
  ~vector(&local_100);
  std::
  vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>::
  ~vector(&local_e8);
  return;
}

Assistant:

void ResultsReportJSONExtensive::DumpNewStruct() {

    if (bHadFailures || bHadSummary || bHadSuccess) {
        WriteNoIndent(",\n");
    }

    auto results = ResultSummary::Instance().Results();
    auto testFunctions = ResultSummary::Instance().TestFunctions();

    static std::map<kTestResult, std::string> resultToName={
            {kTestResult_Pass, "Pass"},
            {kTestResult_AllFail, "AllFail"},
            {kTestResult_ModuleFail,"ModuleFail"},
            {kTestResult_TestFail, "TestFail"},
    };

    WriteLine(R"("Results" : [)");
    PushIndent();

    bool bNeedComma = false;
    for (auto testFunction : testFunctions) {
        if (bNeedComma) {
            WriteNoIndent(",\n");
        }
        PrintFuncResult(testFunction);
        bNeedComma = true;
    }
    PopIndent();
    WriteLine("");
    Write("]");
}